

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void CalculateVertexMetrics(dgVertexCollapseVertexMetric *table,dgBigVector *pool,dgEdge *edge)

{
  dgVertexCollapseVertexMetric *pdVar1;
  HaF64 *pHVar2;
  int i0;
  dgEdge *pdVar3;
  dgBigPlane constrainPlane;
  dgBigPlane local_78;
  dgBigPlane local_50;
  
  i0 = edge->m_incidentVertex;
  pHVar2 = table[i0].elem + 2;
  *pHVar2 = 0.0;
  pHVar2[1] = 0.0;
  pHVar2[2] = 0.0;
  pHVar2[3] = 0.0;
  pHVar2[4] = 0.0;
  pHVar2[5] = 0.0;
  pHVar2[6] = 0.0;
  pHVar2[7] = 0.0;
  pdVar1 = table + i0;
  pdVar1->elem[0] = 0.0;
  pdVar1->elem[1] = 0.0;
  pdVar1->elem[2] = 0.0;
  pdVar1->elem[3] = 0.0;
  pdVar1->elem[4] = 0.0;
  pdVar1->elem[5] = 0.0;
  pdVar1->elem[6] = 0.0;
  pdVar1->elem[7] = 0.0;
  pdVar3 = edge;
  do {
    if (pdVar3->m_incidentFace < 1) {
      UnboundedLoopPlane(&local_78,i0,pdVar3->m_twin->m_incidentVertex,
                         pdVar3->m_twin->m_prev->m_incidentVertex,pool);
      dgVertexCollapseVertexMetric::Accumulate(table + i0,&local_78);
      UnboundedLoopPlane(&local_50,i0,pdVar3->m_prev->m_incidentVertex,
                         pdVar3->m_prev->m_twin->m_prev->m_incidentVertex,pool);
      local_78.super_dgBigVector.super_dgTemplateVector<double>.m_x =
           local_50.super_dgBigVector.super_dgTemplateVector<double>.m_x;
      local_78.super_dgBigVector.super_dgTemplateVector<double>.m_y =
           local_50.super_dgBigVector.super_dgTemplateVector<double>.m_y;
      local_78.super_dgBigVector.super_dgTemplateVector<double>.m_z =
           local_50.super_dgBigVector.super_dgTemplateVector<double>.m_z;
      local_78.super_dgBigVector.super_dgTemplateVector<double>.m_w =
           local_50.super_dgBigVector.super_dgTemplateVector<double>.m_w;
    }
    else {
      EdgePlane(&local_78,i0,pdVar3->m_next->m_incidentVertex,pdVar3->m_prev->m_incidentVertex,pool)
      ;
    }
    dgVertexCollapseVertexMetric::Accumulate(table + i0,&local_78);
    pdVar3 = pdVar3->m_twin->m_next;
  } while (pdVar3 != edge);
  return;
}

Assistant:

static void CalculateVertexMetrics (dgVertexCollapseVertexMetric table[], const dgBigVector* const pool, dgEdge* const edge)
{
	hacd::HaI32 i0 = edge->m_incidentVertex;

//	const dgBigVector& p0 = pool[i0];
	table[i0].Clear ();
	dgEdge* ptr = edge;
	do {

		if (ptr->m_incidentFace > 0) {
			hacd::HaI32 i1 = ptr->m_next->m_incidentVertex;
			hacd::HaI32 i2 = ptr->m_prev->m_incidentVertex;
			dgBigPlane constrainPlane (EdgePlane (i0, i1, i2, pool));
			table[i0].Accumulate (constrainPlane);

		} else {
			hacd::HaI32 i1 = ptr->m_twin->m_incidentVertex;
			hacd::HaI32 i2 = ptr->m_twin->m_prev->m_incidentVertex;
			dgBigPlane constrainPlane (UnboundedLoopPlane (i0, i1, i2, pool));
			table[i0].Accumulate (constrainPlane);

			i1 = ptr->m_prev->m_incidentVertex;
			i2 = ptr->m_prev->m_twin->m_prev->m_incidentVertex;
			constrainPlane = UnboundedLoopPlane (i0, i1, i2, pool);
			table[i0].Accumulate (constrainPlane);
		}

		ptr = ptr->m_twin->m_next;
	} while (ptr != edge);
}